

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffers.h
# Opt level: O0

Offset<flatbuffers::String> __thiscall
flatbuffers::FlatBufferBuilder::CreateString(FlatBufferBuilder *this,char *str,size_t len)

{
  uoffset_t _o;
  size_t len_local;
  char *str_local;
  FlatBufferBuilder *this_local;
  
  NotNested(this);
  PreAlign<unsigned_int>(this,len + 1);
  vector_downward::fill(&this->buf_,1);
  PushBytes(this,(uint8_t *)str,len);
  PushElement<unsigned_int>(this,(uint)len);
  _o = GetSize(this);
  Offset<flatbuffers::String>::Offset((Offset<flatbuffers::String> *)((long)&this_local + 4),_o);
  return (Offset<flatbuffers::String>)this_local._4_4_;
}

Assistant:

Offset<String> CreateString(const char *str, size_t len) {
    NotNested();
    PreAlign<uoffset_t>(len + 1);  // Always 0-terminated.
    buf_.fill(1);
    PushBytes(reinterpret_cast<const uint8_t *>(str), len);
    PushElement(static_cast<uoffset_t>(len));
    return Offset<String>(GetSize());
  }